

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::getStructBufferCounter
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *buffer)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  mapped_type_conflict2 *pmVar3;
  TIntermTyped *pTVar4;
  TIntermConstantUnion *index;
  TString counterBlockName;
  TType local_b8;
  
  if (buffer != (TIntermTyped *)0x0) {
    iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])(buffer);
    bVar1 = isStructBufferType(this,(TType *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar2 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0xc])(buffer);
      name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 400))
                       ((long *)CONCAT44(extraout_var_00,iVar2));
      TIntermediate::
      addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
                (&counterBlockName,this_00,name);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
               ::operator[](&(this->structBufferCounter).
                             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                            ,&counterBlockName);
      *pmVar3 = true;
      pTVar4 = handleVariable(this,loc,&counterBlockName);
      index = TIntermediate::addConstantUnion
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,0,loc,
                         false);
      pTVar4 = TIntermediate::addIndex
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpIndexDirectStruct,pTVar4,&index->super_TIntermTyped,loc);
      TType::TType(&local_b8,EbtUint,EvqTemporary,1,0,0,false);
      (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar4,&local_b8);
      return pTVar4;
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::getStructBufferCounter(const TSourceLoc& loc, TIntermTyped* buffer)
{
    // Bail out if not a struct buffer
    if (buffer == nullptr || ! isStructBufferType(buffer->getType()))
        return nullptr;

    const TString counterBlockName(intermediate.addCounterBufferName(buffer->getAsSymbolNode()->getName()));

    // Mark the counter as being used
    structBufferCounter[counterBlockName] = true;

    TIntermTyped* counterVar = handleVariable(loc, &counterBlockName);  // find the block structure
    TIntermTyped* index = intermediate.addConstantUnion(0, loc); // index to counter inside block struct

    TIntermTyped* counterMember = intermediate.addIndex(EOpIndexDirectStruct, counterVar, index, loc);
    counterMember->setType(TType(EbtUint));
    return counterMember;
}